

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<bool> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryTransferTo
          (InMemoryDirectory *this,Directory *toDirectory,PathPtr toPath,WriteMode toMode,
          PathPtr fromPath,TransferMode mode)

{
  size_t sVar1;
  undefined1 uVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined4 in_register_00000084;
  StringPtr name;
  undefined4 in_stack_00000018;
  undefined4 local_50;
  undefined4 uStack_48;
  FsNode local_40;
  Disposer local_38;
  
  if (fromPath.parts.size_ < 2) {
    *(undefined1 *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = 0;
  }
  else {
    sVar1 = ((fromPath.parts.ptr)->content).size_;
    if (sVar1 == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((fromPath.parts.ptr)->content).ptr;
    }
    name.content.size_ = (size_t)pcVar3;
    name.content.ptr = (char *)toDirectory;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc0,name,(int)sVar1 + (uint)(sVar1 == 0))
    ;
    if (local_38._vptr_Disposer == (_func_int **)0x0) {
      *(undefined1 *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = 0;
    }
    else {
      local_50 = SUB84(fromPath.parts.ptr + 1,0);
      uStack_48 = (undefined4)(fromPath.parts.size_ - 1);
      uVar2 = (**(code **)(((toPath.parts.ptr)->content).ptr + 0xa0))
                        (toPath.parts.ptr,toPath.parts.size_,CONCAT44(in_register_00000084,toMode),
                         mode,local_38._vptr_Disposer,in_stack_00000018,local_50,uStack_48);
      *(undefined1 *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = 1;
      *(undefined1 *)
       ((long)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode + 1) =
           uVar2;
      (**(code **)*local_40._vptr_FsNode)
                (local_40._vptr_FsNode,
                 (long)local_38._vptr_Disposer + *(long *)(*local_38._vptr_Disposer + -0x10),
                 extraout_RDX);
    }
  }
  return (Maybe<bool>)SUB82(this,0);
}

Assistant:

Maybe<bool> tryTransferTo(const Directory& toDirectory, PathPtr toPath, WriteMode toMode,
                            PathPtr fromPath, TransferMode mode) const override {
    if (fromPath.size() <= 1) {
      // If `fromPath` is in this directory (or *is* this directory) then we don't have any
      // optimizations.
      return kj::none;
    }

    // `fromPath` is in a subdirectory. It could turn out that that subdirectory is not an
    // InMemoryDirectory and is instead something `toDirectory` is friendly with. So let's follow
    // the path.

    KJ_IF_SOME(child, tryGetParent(fromPath[0], WriteMode::MODIFY)) {
      // OK, switch back to tryTransfer() but use the subdirectory.
      return toDirectory.tryTransfer(toPath, toMode,
          *child, fromPath.slice(1, fromPath.size()), mode);
    } else {
      // Hmm, doesn't exist. Fall back to standard path.
      return kj::none;
    }
  }